

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

string * __thiscall
hgdb::json::SymbolTable::output_abi_cxx11_(string *__return_storage_ptr__,SymbolTable *this)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long lVar3;
  pointer puVar4;
  Module *pMVar5;
  pointer pVVar6;
  JSONWriter *pJVar7;
  _Base_ptr p_Var8;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  pointer puVar9;
  Variable *v;
  pointer this_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  JSONWriter w;
  char local_221;
  string *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_221 = '{';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),&local_221,1);
  name._M_str = "generator";
  name._M_len = 9;
  pJVar7 = JSONWriter::key((JSONWriter *)local_1b8,name);
  pcVar2 = (this->framework_name_)._M_dataplus._M_p;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar2,pcVar2 + (this->framework_name_)._M_string_length);
  JSONWriter::value<std::__cxx11::string>(pJVar7,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
    name_00._M_str = "top";
    name_00._M_len = 3;
    pJVar7 = JSONWriter::key((JSONWriter *)local_1b8,name_00);
    p_Var8 = (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar3 = *(long *)(p_Var8 + 1);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,lVar3,(long)&(p_Var8[1]._M_parent)->_M_color + lVar3);
    JSONWriter::value<std::__cxx11::string>(pJVar7,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    name_01._M_str = "top";
    name_01._M_len = 3;
    pJVar7 = JSONWriter::key((JSONWriter *)local_1b8,name_01);
    local_221 = '[';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar7->field_0x10,&local_221,1);
    p_Var8 = (this->top_names_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->top_names_)._M_t._M_impl.super__Rb_tree_header;
    local_220 = __return_storage_ptr__;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        JSONWriter::value<std::__cxx11::string>((JSONWriter *)local_1b8,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    JSONWriter::end_array((JSONWriter *)local_1b8);
    __return_storage_ptr__ = local_220;
  }
  name_02._M_str = "table";
  name_02._M_len = 5;
  pJVar7 = JSONWriter::key((JSONWriter *)local_1b8,name_02);
  local_221 = '[';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar7->field_0x10,&local_221,1);
  puVar9 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->modules_).
           super__Vector_base<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 != puVar4) {
    do {
      pMVar5 = (puVar9->_M_t).
               super___uniq_ptr_impl<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>.
               _M_t.
               super__Tuple_impl<0UL,_hgdb::json::Module_*,_std::default_delete<hgdb::json::Module>_>
               .super__Head_base<0UL,_hgdb::json::Module_*,_false>._M_head_impl;
      (*(code *)*(pMVar5->super_Scope<hgdb::json::Module>).super_ScopeBase._vptr_ScopeBase)
                (pMVar5,local_1b8);
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar4);
  }
  JSONWriter::end_array((JSONWriter *)local_1b8);
  if ((this->variables_).
      super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->variables_).
      super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    name_03._M_str = "variables";
    name_03._M_len = 9;
    JSONWriter::key((JSONWriter *)local_1b8,name_03);
    local_221 = '[';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),&local_221,1);
    this_00 = (this->variables_).
              super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pVVar6 = (this->variables_).
             super__Vector_base<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (this_00 != pVVar6) {
      do {
        Variable::serialize(this_00,(JSONWriter *)local_1b8);
        this_00 = this_00 + 1;
      } while (this_00 != pVVar6);
    }
    JSONWriter::end_array((JSONWriter *)local_1b8);
  }
  if (this->reorder_ == false) {
    name_04._M_str = "reorder";
    name_04._M_len = 7;
    pJVar7 = JSONWriter::key((JSONWriter *)local_1b8,name_04);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar7->field_0x10,"false",5);
    local_221 = ',';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar7->field_0x10,&local_221,1);
  }
  JSONWriter::end_obj((JSONWriter *)local_1b8);
  JSONWriter::str_abi_cxx11_(__return_storage_ptr__,(JSONWriter *)local_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string output() const {
        JSONWriter w;
        w.begin_obj();
        w.key("generator").value(framework_name_);

        if (top_names_.size() == 1) {
            w.key("top").value(*top_names_.begin());
        } else {
            w.key("top").begin_array();
            for (auto const &n : top_names_) w.value(n);
            w.end_array();
        }

        w.key("table").begin_array();
        for (auto const &m : modules_) {
            m->serialize(w);
        }
        w.end_array();

        if (!variables_.empty()) {
            w.key("variables");
            w.begin_array();
            for (auto const &v : variables_) {
                v.serialize(w);
            }
            w.end_array();
        }

        // attributes
        if (!reorder_) {
            w.key("reorder").value(false);
        }

        w.end_obj();
        return w.str();
    }